

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode parse_login_details(char *login,size_t len,char **userp,char **passwdp,char **optionsp)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *__dest;
  char *__dest_00;
  CURLcode CVar4;
  char *pcVar5;
  size_t __n;
  char *local_70;
  char *local_68;
  
  if (passwdp == (char **)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar2 = strchr(login,0x3a);
    pcVar5 = (char *)0x0;
    if (pcVar2 < login + len) {
      pcVar5 = pcVar2;
    }
  }
  if (optionsp == (char **)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar3 = strchr(login,0x3b);
    pcVar2 = (char *)0x0;
    if (pcVar3 < login + len) {
      pcVar2 = pcVar3;
    }
  }
  if (pcVar5 == (char *)0x0) {
    __n = (long)pcVar2 - (long)login;
    if (pcVar2 == (char *)0x0) {
      __n = len;
    }
  }
  else {
    pcVar3 = pcVar5;
    if (pcVar2 < pcVar5 && pcVar2 != (char *)0x0) {
      pcVar3 = pcVar2;
    }
    __n = (long)pcVar3 - (long)login;
  }
  if (pcVar5 == (char *)0x0) {
    local_68 = (char *)0x0;
  }
  else {
    local_68 = login + len;
    if (pcVar5 < pcVar2) {
      local_68 = pcVar2;
    }
    if (pcVar2 == (char *)0x0) {
      local_68 = login + len;
    }
    local_68 = local_68 + ~(ulong)pcVar5;
  }
  CVar4 = CURLE_OK;
  if (pcVar2 == (char *)0x0) {
    local_70 = (char *)0x0;
  }
  else {
    local_70 = login + len;
    if (pcVar2 < pcVar5) {
      local_70 = pcVar5;
    }
    if (pcVar5 == (char *)0x0) {
      local_70 = login + len;
    }
    local_70 = local_70 + ~(ulong)pcVar2;
  }
  bVar1 = true;
  if ((userp == (char **)0x0) || (__n == 0)) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = (char *)(*Curl_cmalloc)(__n + 1);
    CVar4 = CURLE_OK;
    if (pcVar3 == (char *)0x0) {
      CVar4 = CURLE_OUT_OF_MEMORY;
      pcVar3 = (char *)0x0;
      bVar1 = false;
    }
  }
  __dest = (char *)0x0;
  if (((passwdp != (char **)0x0) && (bVar1)) && (local_68 != (char *)0x0)) {
    __dest = (char *)(*Curl_cmalloc)((size_t)(local_68 + 1));
    if (__dest == (char *)0x0) {
      (*Curl_cfree)(pcVar3);
      CVar4 = CURLE_OUT_OF_MEMORY;
      __dest = (char *)0x0;
    }
    else {
      CVar4 = CURLE_OK;
    }
  }
  __dest_00 = (char *)0x0;
  if (((optionsp != (char **)0x0) && (CVar4 == CURLE_OK)) && (local_70 != (char *)0x0)) {
    __dest_00 = (char *)(*Curl_cmalloc)((size_t)(local_70 + 1));
    if (__dest_00 == (char *)0x0) {
      (*Curl_cfree)(__dest);
      (*Curl_cfree)(pcVar3);
      CVar4 = CURLE_OUT_OF_MEMORY;
      __dest_00 = (char *)0x0;
    }
    else {
      CVar4 = CURLE_OK;
    }
  }
  if (CVar4 == CURLE_OK) {
    if (pcVar3 != (char *)0x0) {
      memcpy(pcVar3,login,__n);
      pcVar3[__n] = '\0';
      (*Curl_cfree)(*userp);
      *userp = pcVar3;
    }
    if (__dest != (char *)0x0) {
      memcpy(__dest,pcVar5 + 1,(size_t)local_68);
      __dest[(long)local_68] = '\0';
      (*Curl_cfree)(*passwdp);
      *passwdp = __dest;
    }
    if (__dest_00 != (char *)0x0) {
      memcpy(__dest_00,pcVar2 + 1,(size_t)local_70);
      __dest_00[(long)local_70] = '\0';
      (*Curl_cfree)(*optionsp);
      *optionsp = __dest_00;
    }
  }
  return CVar4;
}

Assistant:

static CURLcode parse_login_details(const char *login, const size_t len,
                                    char **userp, char **passwdp,
                                    char **optionsp)
{
  CURLcode result = CURLE_OK;
  char *ubuf = NULL;
  char *pbuf = NULL;
  char *obuf = NULL;
  const char *psep = NULL;
  const char *osep = NULL;
  size_t ulen;
  size_t plen;
  size_t olen;

  /* Attempt to find the password separator */
  if(passwdp) {
    psep = strchr(login, ':');

    /* Within the constraint of the login string */
    if(psep >= login + len)
      psep = NULL;
  }

  /* Attempt to find the options separator */
  if(optionsp) {
    osep = strchr(login, ';');

    /* Within the constraint of the login string */
    if(osep >= login + len)
      osep = NULL;
  }

  /* Calculate the portion lengths */
  ulen = (psep ?
          (size_t)(osep && psep > osep ? osep - login : psep - login) :
          (osep ? (size_t)(osep - login) : len));
  plen = (psep ?
          (osep && osep > psep ? (size_t)(osep - psep) :
                                 (size_t)(login + len - psep)) - 1 : 0);
  olen = (osep ?
          (psep && psep > osep ? (size_t)(psep - osep) :
                                 (size_t)(login + len - osep)) - 1 : 0);

  /* Allocate the user portion buffer */
  if(userp && ulen) {
    ubuf = malloc(ulen + 1);
    if(!ubuf)
      result = CURLE_OUT_OF_MEMORY;
  }

  /* Allocate the password portion buffer */
  if(!result && passwdp && plen) {
    pbuf = malloc(plen + 1);
    if(!pbuf) {
      free(ubuf);
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  /* Allocate the options portion buffer */
  if(!result && optionsp && olen) {
    obuf = malloc(olen + 1);
    if(!obuf) {
      free(pbuf);
      free(ubuf);
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  if(!result) {
    /* Store the user portion if necessary */
    if(ubuf) {
      memcpy(ubuf, login, ulen);
      ubuf[ulen] = '\0';
      Curl_safefree(*userp);
      *userp = ubuf;
    }

    /* Store the password portion if necessary */
    if(pbuf) {
      memcpy(pbuf, psep + 1, plen);
      pbuf[plen] = '\0';
      Curl_safefree(*passwdp);
      *passwdp = pbuf;
    }

    /* Store the options portion if necessary */
    if(obuf) {
      memcpy(obuf, osep + 1, olen);
      obuf[olen] = '\0';
      Curl_safefree(*optionsp);
      *optionsp = obuf;
    }
  }

  return result;
}